

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_data.cc
# Opt level: O3

void print_raw_text(int f,string s,v_array<char> tag)

{
  ulong uVar1;
  int *piVar2;
  char *__s;
  size_t sVar3;
  undefined8 *in_RSI;
  char local_1c8;
  undefined7 uStack_1c7;
  ulong local_1c0;
  undefined1 local_1b8 [16];
  stringstream local_1a8 [16];
  undefined1 local_198 [376];
  
  if (-1 < f) {
    std::__cxx11::stringstream::stringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,(char *)*in_RSI,in_RSI[1]);
    print_tag((stringstream *)local_1a8,(v_array<char>)s);
    local_1c8 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,&local_1c8,1);
    std::__cxx11::stringbuf::str();
    if ((undefined1 *)CONCAT71(uStack_1c7,local_1c8) != local_1b8) {
      operator_delete((undefined1 *)CONCAT71(uStack_1c7,local_1c8));
    }
    std::__cxx11::stringbuf::str();
    uVar1 = io_buf::write_file_or_socket
                      (f,(void *)CONCAT71(uStack_1c7,local_1c8),local_1c0 & 0xffffffff);
    if ((undefined1 *)CONCAT71(uStack_1c7,local_1c8) != local_1b8) {
      operator_delete((undefined1 *)CONCAT71(uStack_1c7,local_1c8));
    }
    if (uVar1 != local_1c0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"write error: ",0xd);
      piVar2 = __errno_location();
      __s = strerror(*piVar2);
      if (__s == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x2dca28);
      }
      else {
        sVar3 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,__s,sVar3);
      }
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '(');
      std::ostream::put('(');
      std::ostream::flush();
    }
    std::__cxx11::stringstream::~stringstream(local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_198 + 0x70));
  }
  return;
}

Assistant:

void print_raw_text(int f, string s, v_array<char> tag)
{
  if (f < 0)
    return;

  std::stringstream ss;
  ss << s;
  print_tag(ss, tag);
  ss << '\n';
  ssize_t len = ss.str().size();
  ssize_t t = io_buf::write_file_or_socket(f, ss.str().c_str(), (unsigned int)len);
  if (t != len)
  {
    cerr << "write error: " << strerror(errno) << endl;
  }
}